

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O0

void replay_wait_for_steal_if_parent_was_stolen_internal(__cilkrts_worker *w)

{
  bool bVar1;
  replay_entry_t *prVar2;
  long *in_RDI;
  
  bVar1 = replay_entry_t::match
                    (*(replay_entry_t **)(in_RDI[7] + 0x1c0),ped_type_orphaned,
                     (__cilkrts_pedigree *)in_RDI[0xd],-1);
  if (bVar1) {
    while ((ulong)in_RDI[1] <= *in_RDI - 8U) {
      __cilkrts_sleep();
    }
    prVar2 = replay_entry_t::next_entry(*(replay_entry_t **)(in_RDI[7] + 0x1c0));
    *(replay_entry_t **)(in_RDI[7] + 0x1c0) = prVar2;
  }
  return;
}

Assistant:

void replay_wait_for_steal_if_parent_was_stolen_internal(__cilkrts_worker *w)
{
    // If our parent wasn't recorded orphanen, return now
    if (! w->l->replay_list_entry->match (ped_type_orphaned,
                                              w->pedigree.parent))
        return;

    // Stall until our parent is stolen.  Note that we're comparing head
    // and tail, not head and exc.  The steal is not completed until tail
    // is modified.
    while (!((w->tail - 1) < w->head))
        __cilkrts_sleep();

    // Consume the entry
    w->l->replay_list_entry = w->l->replay_list_entry->next_entry();
}